

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O1

Matrix<double,_4,_4> *
gl4cts::Math::inverse<4>(Matrix<double,_4,_4> *__return_storage_ptr__,Matrix<double,_4,_4> *matrix)

{
  GLuint c;
  double *pdVar1;
  ulong uVar2;
  Matrix<double,_4,_4> *pMVar3;
  Matrix<double,_4,_4> *pMVar4;
  long lVar5;
  int row;
  long lVar6;
  long lVar7;
  ulong uVar8;
  Vector<double,_4> *pVVar9;
  GLuint c_1;
  Matrix<double,_4,_4> *pMVar10;
  ulong uVar11;
  int row_1;
  GLuint r_1;
  ulong uVar12;
  undefined8 uVar13;
  double dVar14;
  Matrix<double,_4,_4> adjugate;
  Matrix<double,_4,_4> cof;
  double adStack_138 [4];
  Matrix<double,_4,_4> local_118;
  double local_98 [16];
  
  pMVar3 = &local_118;
  pMVar4 = &local_118;
  pdVar1 = local_98;
  local_98[0xe] = 0.0;
  local_98[0xf] = 0.0;
  local_98[0xc] = 0.0;
  local_98[0xd] = 0.0;
  local_98[10] = 0.0;
  local_98[0xb] = 0.0;
  local_98[8] = 0.0;
  local_98[9] = 0.0;
  local_98[6] = 0.0;
  local_98[7] = 0.0;
  local_98[4] = 0.0;
  local_98[5] = 0.0;
  local_98[2] = 0.0;
  local_98[3] = 0.0;
  local_98[0] = 0.0;
  local_98[1] = 0.0;
  lVar5 = 0;
  lVar6 = 0;
  do {
    lVar7 = 0;
    do {
      uVar13 = 0x3ff0000000000000;
      if (lVar5 != lVar7) {
        uVar13 = 0;
      }
      *(undefined8 *)((long)pdVar1 + lVar7) = uVar13;
      lVar7 = lVar7 + 0x20;
    } while (lVar7 != 0x80);
    lVar6 = lVar6 + 1;
    pdVar1 = pdVar1 + 1;
    lVar5 = lVar5 + 0x20;
  } while (lVar6 != 4);
  uVar2 = 0;
  do {
    uVar8 = 0;
    do {
      local_118.m_data.m_data[1].m_data[2] = 0.0;
      local_118.m_data.m_data[1].m_data[3] = 0.0;
      local_118.m_data.m_data[1].m_data[0] = 0.0;
      local_118.m_data.m_data[1].m_data[1] = 0.0;
      local_118.m_data.m_data[0].m_data[2] = 0.0;
      local_118.m_data.m_data[0].m_data[3] = 0.0;
      local_118.m_data.m_data[0].m_data[0] = 0.0;
      local_118.m_data.m_data[0].m_data[1] = 0.0;
      local_118.m_data.m_data[2].m_data[0] = 0.0;
      lVar5 = 0;
      lVar6 = 0;
      pMVar10 = &local_118;
      do {
        lVar7 = 0;
        do {
          uVar13 = 0x3ff0000000000000;
          if (lVar5 != lVar7) {
            uVar13 = 0;
          }
          *(undefined8 *)((long)pMVar10 + lVar7) = uVar13;
          lVar7 = lVar7 + 0x18;
        } while (lVar7 != 0x48);
        lVar6 = lVar6 + 1;
        pMVar10 = (Matrix<double,_4,_4> *)((long)pMVar10 + 8);
        lVar5 = lVar5 + 0x18;
      } while (lVar6 != 3);
      uVar11 = 0;
      pVVar9 = (Vector<double,_4> *)matrix;
      do {
        if (uVar11 != uVar2) {
          uVar12 = 0;
          do {
            if (uVar8 != uVar12) {
              local_118.m_data.m_data[0].m_data
              [(long)(int)((int)uVar11 - (uint)(uVar2 < uVar11)) * 3 +
               (long)(int)((int)uVar12 - (uint)(uVar8 < uVar12))] =
                   ((Vector<tcu::Vector<double,_4>,_4> *)pVVar9->m_data)->m_data[0].m_data[uVar12];
            }
            uVar12 = uVar12 + 1;
          } while (uVar12 != 4);
        }
        uVar11 = uVar11 + 1;
        pVVar9 = pVVar9 + 1;
      } while (uVar11 != 4);
      dVar14 = (local_118.m_data.m_data[0].m_data[1] * local_118.m_data.m_data[1].m_data[1] -
               local_118.m_data.m_data[1].m_data[0] * local_118.m_data.m_data[0].m_data[2]) *
               local_118.m_data.m_data[1].m_data[2] +
               ((local_118.m_data.m_data[1].m_data[0] * local_118.m_data.m_data[2].m_data[0] -
                local_118.m_data.m_data[1].m_data[3] * local_118.m_data.m_data[1].m_data[1]) *
                local_118.m_data.m_data[0].m_data[0] -
               (local_118.m_data.m_data[2].m_data[0] * local_118.m_data.m_data[0].m_data[1] -
               local_118.m_data.m_data[1].m_data[3] * local_118.m_data.m_data[0].m_data[2]) *
               local_118.m_data.m_data[0].m_data[3]);
      if (((int)uVar8 + (int)uVar2 & 1U) != 0) {
        dVar14 = -dVar14;
      }
      local_98[uVar2 * 4 + uVar8] = dVar14;
      uVar8 = uVar8 + 1;
    } while (uVar8 != 4);
    uVar2 = uVar2 + 1;
  } while (uVar2 != 4);
  local_118.m_data.m_data[3].m_data[2] = 0.0;
  local_118.m_data.m_data[3].m_data[3] = 0.0;
  local_118.m_data.m_data[3].m_data[0] = 0.0;
  local_118.m_data.m_data[3].m_data[1] = 0.0;
  local_118.m_data.m_data[2].m_data[2] = 0.0;
  local_118.m_data.m_data[2].m_data[3] = 0.0;
  local_118.m_data.m_data[2].m_data[0] = 0.0;
  local_118.m_data.m_data[2].m_data[1] = 0.0;
  local_118.m_data.m_data[1].m_data[2] = 0.0;
  local_118.m_data.m_data[1].m_data[3] = 0.0;
  local_118.m_data.m_data[1].m_data[0] = 0.0;
  local_118.m_data.m_data[1].m_data[1] = 0.0;
  local_118.m_data.m_data[0].m_data[2] = 0.0;
  local_118.m_data.m_data[0].m_data[3] = 0.0;
  local_118.m_data.m_data[0].m_data[0] = 0.0;
  local_118.m_data.m_data[0].m_data[1] = 0.0;
  lVar5 = 0;
  lVar6 = 0;
  do {
    lVar7 = 0;
    do {
      uVar13 = 0x3ff0000000000000;
      if (lVar5 != lVar7) {
        uVar13 = 0;
      }
      *(undefined8 *)((long)pMVar3 + lVar7) = uVar13;
      lVar7 = lVar7 + 0x20;
    } while (lVar7 != 0x80);
    lVar6 = lVar6 + 1;
    pMVar3 = (Matrix<double,_4,_4> *)((long)pMVar3 + 8);
    lVar5 = lVar5 + 0x20;
  } while (lVar6 != 4);
  pdVar1 = local_98;
  lVar5 = 0;
  do {
    lVar6 = 0;
    do {
      *(undefined8 *)((long)pMVar4 + lVar6) = *(undefined8 *)((long)pdVar1 + lVar6 * 4);
      lVar6 = lVar6 + 8;
    } while (lVar6 != 0x20);
    lVar5 = lVar5 + 1;
    pMVar4 = (Matrix<double,_4,_4> *)((long)pMVar4 + 0x20);
    pdVar1 = pdVar1 + 1;
  } while (lVar5 != 4);
  dVar14 = determinant<double>(matrix);
  tcu::operator*(__return_storage_ptr__,&local_118,1.0 / dVar14);
  return __return_storage_ptr__;
}

Assistant:

static tcu::Matrix<glw::GLdouble, Size, Size> inverse(const tcu::Matrix<glw::GLdouble, Size, Size>& matrix)
{
	const tcu::Matrix<glw::GLdouble, Size, Size> cof	  = cofactors(matrix);
	const tcu::Matrix<glw::GLdouble, Size, Size> adjugate = tcu::transpose(cof);
	const glw::GLdouble det		= determinant(matrix);
	const glw::GLdouble inv_det = 1.0 / det;

	tcu::Matrix<glw::GLdouble, Size, Size> result = adjugate * inv_det;

	return result;
}